

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

void __thiscall
Lib::
DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::expand(DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this)

{
  uint uVar1;
  uint uVar2;
  uint *__ptr;
  uint *puVar3;
  undefined8 uVar4;
  Entry *pEVar5;
  uint *in_RDI;
  Entry *ep;
  int oldCapacity;
  uint oldTimestamp;
  Entry *oldAfterLast;
  Entry *oldEntries;
  void *mem;
  int newCapacity;
  Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar6;
  size_t in_stack_ffffffffffffff88;
  Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *in_stack_ffffffffffffff90;
  DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  Exception *in_stack_ffffffffffffffb0;
  uint *local_40;
  
  if (0x1c < (int)in_RDI[3]) {
    uVar4 = __cxa_allocate_exception(0x28);
    Lib::Exception::Exception(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __cxa_throw(uVar4,&Lib::Exception::typeinfo,Lib::Exception::~Exception);
  }
  uVar6 = *(uint *)(DHMapTableCapacities + (long)(int)(in_RDI[3] + 1) * 4);
  Lib::alloc(CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  __ptr = *(uint **)(in_RDI + 6);
  puVar3 = *(uint **)(in_RDI + 8);
  uVar1 = *in_RDI;
  uVar2 = in_RDI[4];
  *in_RDI = 1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = in_RDI[3] + 1;
  in_RDI[4] = uVar6;
  in_RDI[5] = *(uint *)(DHMapTableNextExpansions + (long)(int)in_RDI[3] * 4);
  pEVar5 = array_new<Lib::DHMap<unsigned_int,Lib::Stack<std::pair<Kernel::SymbolType,unsigned_int>>,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                     (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(Entry **)(in_RDI + 6) = pEVar5;
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 6) + (long)(int)in_RDI[4] * 0x28;
  local_40 = __ptr;
  while (local_40 != puVar3) {
    if ((*local_40 >> 2 == uVar1) && ((*local_40 & 1) == 0)) {
      uVar6 = local_40[1];
      Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>::Stack
                ((Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *)
                 CONCAT44(uVar6,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
      insert(in_stack_ffffffffffffffa0,(uint)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff90);
      Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>::~Stack
                ((Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *)
                 CONCAT44(uVar6,in_stack_ffffffffffffff80));
    }
    local_40 = local_40 + 10;
    Entry::~Entry((Entry *)0x8740bb);
  }
  if (uVar2 != 0) {
    Lib::free(__ptr);
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }